

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O2

int map_clear(map m)

{
  size_t size;
  bucket pbVar1;
  long lVar2;
  size_t iterator;
  ulong uVar3;
  
  if (m != (map)0x0) {
    if (m->buckets != (bucket)0x0) {
      lVar2 = 0x10;
      for (uVar3 = 0; uVar3 < m->capacity; uVar3 = uVar3 + 1) {
        free(*(void **)((long)&m->buckets->count + lVar2));
        lVar2 = lVar2 + 0x18;
      }
      free(m->buckets);
    }
    m->count = 0;
    m->prime = 0;
    size = bucket_capacity(0);
    m->capacity = size;
    pbVar1 = bucket_create(size);
    m->buckets = pbVar1;
    if (pbVar1 != (bucket)0x0) {
      return 0;
    }
    log_write_impl_va("metacall",0x1d1,"map_clear",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                      ,LOG_LEVEL_ERROR,"Bad map clear bucket creation");
  }
  return 1;
}

Assistant:

int map_clear(map m)
{
	if (m == NULL)
	{
		return 1;
	}

	if (m->buckets != NULL)
	{
		size_t iterator;

		for (iterator = 0; iterator < m->capacity; ++iterator)
		{
			bucket b = &m->buckets[iterator];

			if (b->pairs != NULL)
			{
				free(b->pairs);
			}
		}

		free(m->buckets);
	}

	m->count = 0;
	m->prime = 0;
	m->capacity = bucket_capacity(m->prime);
	m->buckets = bucket_create(m->capacity);

	if (m->buckets == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad map clear bucket creation");
		return 1;
	}

	return 0;
}